

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EmitterBeam::Encode(EmitterBeam *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pTVar3;
  __normal_iterator<const_KDIS::DATA_TYPE::TrackJamTargetIdentifier_*,_std::vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  EmitterBeam *this_local;
  
  pKVar2 = KDataStream::operator<<(stream,this->m_ui8BeamDataLength);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8EmitterBeamIDNumber);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16BeamParamIndex);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_FundamentalParameterData).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8BeamFunction);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8NumTargetInTrackJamField);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8HighDensityTrackJam);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_BeamStatus).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar2,&(this->m_JammingTechnique).super_DataTypeBase);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
            ::begin(&this->m_vTrackJamTargets);
  local_28._M_current =
       (TrackJamTargetIdentifier *)
       std::
       vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
       ::end(&this->m_vTrackJamTargets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::TrackJamTargetIdentifier_*,_std::vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>_>
             ::operator->(&citrEnd);
    (*(pTVar3->super_EntityIdentifier).super_SimulationIdentifier.super_DataTypeBase.
      _vptr_DataTypeBase[5])(pTVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::TrackJamTargetIdentifier_*,_std::vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void EmitterBeam::Encode( KDataStream & stream ) const
{
    stream << m_ui8BeamDataLength
           << m_ui8EmitterBeamIDNumber
           << m_ui16BeamParamIndex
           << KDIS_STREAM m_FundamentalParameterData
           << m_ui8BeamFunction
           << m_ui8NumTargetInTrackJamField
           << m_ui8HighDensityTrackJam
#if DIS_VERSION < 7
           << m_ui8Padding
           << m_ui32JammingModeSequence;
#elif DIS_VERSION > 6
           << KDIS_STREAM m_BeamStatus
           << KDIS_STREAM m_JammingTechnique;
#endif

    vector<TrackJamTargetIdentifier>::const_iterator citr = m_vTrackJamTargets.begin();
    vector<TrackJamTargetIdentifier>::const_iterator citrEnd = m_vTrackJamTargets.end();

    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}